

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-hash.cpp
# Opt level: O0

bool hash_params_parse(int argc,char **argv,hash_params *params)

{
  invalid_argument *ex;
  bool result;
  hash_params *in_stack_000000c0;
  char **in_stack_000000c8;
  int in_stack_000000d4;
  
  hash_params_parse_ex(in_stack_000000d4,in_stack_000000c8,in_stack_000000c0);
  return true;
}

Assistant:

static bool hash_params_parse(int argc, const char ** argv, hash_params & params) {
    bool result = true;
    try {
        hash_params_parse_ex(argc, argv, params);
    }
    catch (const std::invalid_argument & ex) {
        fprintf(stderr, "%s\n", ex.what());
        hash_print_usage(argv[0]);
        exit(EXIT_FAILURE);
    }
    return result;
}